

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O2

void crnlib::dxt_fast::find_representative_colors
               (uint n,color_quad_u8 *pBlock,color_quad_u8 *lo,color_quad_u8 *hi)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  ulong uVar5;
  undefined1 uVar6;
  uint i_2;
  uint uVar7;
  long lVar8;
  undefined1 uVar9;
  uint uVar10;
  ulong uVar11;
  uchar *puVar12;
  int iVar13;
  uint i_3;
  int iVar14;
  uint i_1;
  int iVar15;
  undefined1 *puVar16;
  undefined1 uVar17;
  uint j;
  undefined1 uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  uint i;
  ulong uVar22;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_b8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_b4;
  uchar local_ae [2];
  byte local_ac;
  uchar local_ab [2];
  byte local_a9;
  uint local_a8 [6];
  color_quad_u8 *local_90;
  color_quad_u8 *local_88;
  ulong local_80;
  ulong uStack_78;
  uint8 new_color8 [2] [3];
  uint weight [2];
  undefined1 auStack_68 [4];
  uint ave [3];
  uint64 local_58 [5];
  uint64 new_color [2] [3];
  
  uVar5 = (ulong)n;
  lVar8 = 0;
  lVar19 = 0;
  lVar21 = 0;
  for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
    lVar8 = lVar8 + (ulong)pBlock[uVar11].field_0.field_0.r;
    lVar19 = lVar19 + (ulong)pBlock[uVar11].field_0.field_0.g;
    lVar21 = lVar21 + (ulong)pBlock[uVar11].field_0.field_0.b;
  }
  uVar11 = (ulong)(n >> 1);
  local_a8[3] = (uint)((lVar8 + uVar11) / uVar5);
  local_a8[4] = (uint)((lVar19 + uVar11) / uVar5);
  local_a8[5] = (uint)((lVar21 + uVar11) / uVar5);
  iVar13 = -1;
  uVar11 = 0;
  for (uVar22 = 0; uVar5 != uVar22; uVar22 = uVar22 + 1) {
    iVar14 = pBlock[uVar22].field_0.field_0.r - local_a8[3];
    iVar15 = pBlock[uVar22].field_0.field_0.g - local_a8[4];
    iVar20 = pBlock[uVar22].field_0.field_0.b - local_a8[5];
    iVar14 = iVar20 * iVar20 + iVar15 * iVar15 + iVar14 * iVar14;
    if (iVar13 < iVar14) {
      uVar11 = uVar22 & 0xffffffff;
      iVar13 = iVar14;
    }
  }
  local_b4 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
              &pBlock[uVar11].field_0.field_0;
  iVar13 = -1;
  uVar11 = 0;
  for (uVar22 = 0; uVar5 != uVar22; uVar22 = uVar22 + 1) {
    iVar15 = (uint)pBlock[uVar22].field_0.field_0.r - (local_b4.m_u32 & 0xff);
    iVar20 = (uint)pBlock[uVar22].field_0.field_0.g - (local_b4.m_u32 >> 8 & 0xff);
    iVar14 = (uint)pBlock[uVar22].field_0.field_0.b - (local_b4.m_u32 >> 0x10 & 0xff);
    iVar14 = iVar14 * iVar14 + iVar20 * iVar20 + iVar15 * iVar15;
    if (iVar13 < iVar14) {
      uVar11 = uVar22 & 0xffffffff;
      iVar13 = iVar14;
    }
  }
  local_b8.field_0 =
       *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
        &pBlock[uVar11].field_0.field_0;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    uVar7 = local_a8[lVar8 + 3];
    local_b4.c[lVar8] = (uchar)(local_b4.c[lVar8] + uVar7 >> 1);
    local_b8.c[lVar8] = (uchar)(local_b8.c[lVar8] + uVar7 >> 1);
  }
  iVar13 = 0;
  local_90 = lo;
  local_88 = hi;
  while( true ) {
    if (iVar13 == 4) break;
    local_80 = (ulong)local_b8.field_0.g;
    uStack_78 = (ulong)local_b4.field_0.g;
    if ((local_b4.field_0.r == local_b8.field_0.r) &&
       (local_b4.field_0.b == local_b8.field_0.b && local_b4.field_0.g == local_b8.field_0.g))
    break;
    _auStack_68 = 0;
    ave[1] = 0;
    ave[2] = 0;
    local_a8[0] = 0;
    local_a8[1] = 0;
    iVar14 = (local_b8.m_u32 & 0xff) - (local_b4.m_u32 & 0xff);
    iVar15 = (uint)local_b8.field_0.g - (uint)local_b4.field_0.g;
    iVar20 = (uint)local_b8.field_0.b - (uint)local_b4.field_0.b;
    for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
      bVar1 = pBlock[uVar11].field_0.field_0.r;
      bVar2 = pBlock[uVar11].field_0.field_0.g;
      bVar3 = pBlock[uVar11].field_0.field_0.b;
      uVar22 = (ulong)((int)(((local_b8.m_u32 & 0xff) + (local_b4.m_u32 & 0xff)) * iVar14 +
                             ((uint)local_b4.field_0.g + (uint)local_b8.field_0.g) * iVar15 +
                            ((uint)local_b4.field_0.b + (uint)local_b8.field_0.b) * iVar20) <
                      (int)(iVar20 * 2 * (uint)bVar3 +
                           iVar15 * 2 * (uint)bVar2 + iVar14 * 2 * (uint)bVar1));
      *(ulong *)(auStack_68 + uVar22 * 0x18) = *(long *)(auStack_68 + uVar22 * 0x18) + (ulong)bVar1;
      *(ulong *)(ave + uVar22 * 6 + 1) = *(long *)(ave + uVar22 * 6 + 1) + (ulong)bVar2;
      new_color[uVar22 - 2][1] = new_color[uVar22 - 2][1] + (ulong)bVar3;
      local_a8[uVar22] = local_a8[uVar22] + 1;
    }
    if ((local_a8[0] == 0) || (local_a8[1] == 0)) break;
    puVar12 = local_ae;
    puVar16 = auStack_68;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar7 = local_a8[lVar8];
      for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
        puVar12[lVar19] =
             (uchar)((*(long *)(puVar16 + lVar19 * 8) + (ulong)(uVar7 >> 1)) / (ulong)uVar7);
      }
      puVar16 = puVar16 + 0x18;
      puVar12 = puVar12 + 3;
    }
    if ((((local_ae[0] == local_b4.field_0.r) && (local_ae[1] == (char)uStack_78)) &&
        (local_ac == local_b4.field_0.b)) &&
       (((local_ab[0] == local_b8.field_0.r && (local_ab[1] == (char)local_80)) &&
        (local_a9 == local_b8.field_0.b)))) break;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      uVar4 = local_ae[lVar8 + 3];
      local_b4.c[lVar8] = local_ae[lVar8];
      local_b8.c[lVar8] = uVar4;
    }
    iVar13 = iVar13 + 1;
  }
  uVar7 = 0;
  uVar10 = 0;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    uVar7 = uVar7 + (uint)local_b4.c[lVar8] * (uint)local_b4.c[lVar8];
    uVar10 = uVar10 + (uint)local_b8.c[lVar8] * (uint)local_b8.c[lVar8];
  }
  uVar18 = local_b8.field_0.r;
  uVar17 = local_b8.field_0.g;
  uVar9 = local_b8.field_0.b;
  uVar6 = local_b8.field_0.a;
  if (uVar10 < uVar7) {
    uVar18 = local_b4.field_0.r;
    local_b4.field_0.r = local_b8.field_0.r;
    uVar17 = local_b4.field_0.g;
    local_b4.field_0.g = local_b8.field_0.g;
    uVar9 = local_b4.field_0.b;
    local_b4.field_0.b = local_b8.field_0.b;
    uVar6 = local_b4.field_0.a;
    local_b4.field_0.a = local_b8.field_0.a;
  }
  (local_90->field_0).field_0.r = local_b4.field_0.r;
  (local_90->field_0).field_0.g = local_b4.field_0.g;
  (local_90->field_0).field_0.b = local_b4.field_0.b;
  (local_90->field_0).field_0.a = local_b4.field_0.a;
  (local_88->field_0).field_0.r = uVar18;
  (local_88->field_0).field_0.g = uVar17;
  (local_88->field_0).field_0.b = uVar9;
  (local_88->field_0).field_0.a = uVar6;
  return;
}

Assistant:

void find_representative_colors(uint n, const color_quad_u8* pBlock, color_quad_u8& lo, color_quad_u8& hi)
        {
            uint64 ave64[3];
            ave64[0] = 0;
            ave64[1] = 0;
            ave64[2] = 0;

            for (uint i = 0; i < n; i++)
            {
                ave64[0] += pBlock[i].r;
                ave64[1] += pBlock[i].g;
                ave64[2] += pBlock[i].b;
            }

            uint ave[3];
            ave[0] = static_cast<uint>((ave64[0] + (n / 2)) / n);
            ave[1] = static_cast<uint>((ave64[1] + (n / 2)) / n);
            ave[2] = static_cast<uint>((ave64[2] + (n / 2)) / n);

            int furthest_dist = -1;
            uint furthest_index = 0;
            for (uint i = 0; i < n; i++)
            {
                int r = pBlock[i].r - ave[0];
                int g = pBlock[i].g - ave[1];
                int b = pBlock[i].b - ave[2];
                int dist = r * r + g * g + b * b;
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest_index = i;
                }
            }

            color_quad_u8 lo_color(pBlock[furthest_index]);

            int opp_dist = -1;
            uint opp_index = 0;
            for (uint i = 0; i < n; i++)
            {
                int r = pBlock[i].r - lo_color.r;
                int g = pBlock[i].g - lo_color.g;
                int b = pBlock[i].b - lo_color.b;
                int dist = r * r + g * g + b * b;
                if (dist > opp_dist)
                {
                    opp_dist = dist;
                    opp_index = i;
                }
            }

            color_quad_u8 hi_color(pBlock[opp_index]);

            for (uint i = 0; i < 3; i++)
            {
                lo_color[i] = static_cast<uint8>((lo_color[i] + ave[i]) >> 1);
                hi_color[i] = static_cast<uint8>((hi_color[i] + ave[i]) >> 1);
            }

            const uint cMaxIters = 4;
            for (uint iter_index = 0; iter_index < cMaxIters; iter_index++)
            {
                if ((lo_color[0] == hi_color[0]) && (lo_color[1] == hi_color[1]) && (lo_color[2] == hi_color[2]))
                {
                    break;
                }

                uint64 new_color[2][3];
                uint weight[2];

                utils::zero_object(new_color);
                utils::zero_object(weight);

                int vec_r = hi_color[0] - lo_color[0];
                int vec_g = hi_color[1] - lo_color[1];
                int vec_b = hi_color[2] - lo_color[2];

                int lo_dot = vec_r * lo_color[0] + vec_g * lo_color[1] + vec_b * lo_color[2];
                int hi_dot = vec_r * hi_color[0] + vec_g * hi_color[1] + vec_b * hi_color[2];
                int mid_dot = lo_dot + hi_dot;

                vec_r *= 2;
                vec_g *= 2;
                vec_b *= 2;

                for (uint i = 0; i < n; i++)
                {
                    const color_quad_u8& c = pBlock[i];

                    const int dot = c[0] * vec_r + c[1] * vec_g + c[2] * vec_b;
                    const uint match_index = (dot > mid_dot);

                    new_color[match_index][0] += c.r;
                    new_color[match_index][1] += c.g;
                    new_color[match_index][2] += c.b;
                    weight[match_index]++;
                }

                if ((!weight[0]) || (!weight[1]))
                {
                    break;
                }

                uint8 new_color8[2][3];

                for (uint j = 0; j < 2; j++)
                {
                    for (uint i = 0; i < 3; i++)
                    {
                        new_color8[j][i] = static_cast<uint8>((new_color[j][i] + (weight[j] / 2)) / weight[j]);
                    }
                }

                if ((new_color8[0][0] == lo_color[0]) && (new_color8[0][1] == lo_color[1]) && (new_color8[0][2] == lo_color[2]) &&
                    (new_color8[1][0] == hi_color[0]) && (new_color8[1][1] == hi_color[1]) && (new_color8[1][2] == hi_color[2]))
                {
                    break;
                }

                for (uint i = 0; i < 3; i++)
                {
                    lo_color[i] = new_color8[0][i];
                    hi_color[i] = new_color8[1][i];
                }
            }

            uint energy[2] = { 0, 0 };
            for (uint i = 0; i < 3; i++)
            {
                energy[0] += lo_color[i] * lo_color[i];
                energy[1] += hi_color[i] * hi_color[i];
            }

            if (energy[0] > energy[1])
            {
                std::swap(lo_color, hi_color);
            }

            lo = lo_color;
            hi = hi_color;
        }